

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::tools::Base64Encode_abi_cxx11_
          (string *__return_storage_ptr__,tools *this,char *bytes_to_encode,unsigned_long in_len)

{
  char *pcVar1;
  unsigned_long uVar2;
  int iVar3;
  undefined1 local_2f [3];
  undefined1 uStack_2c;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  int j;
  int i;
  unsigned_long in_len_local;
  char *bytes_to_encode_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  stack0xffffffffffffffd8 = 0;
  _uStack_2c = 0;
  _i = bytes_to_encode;
  in_len_local = (unsigned_long)this;
  while (pcVar1 = _i + -1, _i != (char *)0x0) {
    uVar2 = in_len_local + 1;
    iVar3 = stack0xffffffffffffffd8 + 1;
    local_2f[stack0xffffffffffffffd8] = *(undefined1 *)in_len_local;
    unique0x100000ff = iVar3;
    _i = pcVar1;
    in_len_local = uVar2;
    if (iVar3 == 3) {
      for (stack0xffffffffffffffd8 = 0; stack0xffffffffffffffd8 < 4;
          register0x00000000 = stack0xffffffffffffffd8 + 1) {
        pcVar1 = (char *)std::__cxx11::string::operator[](0x3b4988);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
      }
      stack0xffffffffffffffd8 = 0;
    }
  }
  if (stack0xffffffffffffffd8 != 0) {
    for (_uStack_2c = stack0xffffffffffffffd8; _uStack_2c < 3; _uStack_2c = _uStack_2c + 1) {
      local_2f[_uStack_2c] = 0;
    }
    for (_uStack_2c = 0; _uStack_2c < stack0xffffffffffffffd8 + 1; _uStack_2c = _uStack_2c + 1) {
      pcVar1 = (char *)std::__cxx11::string::operator[](0x3b4988);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
    }
    while (stack0xffffffffffffffd8 < 3) {
      unique0x100000f7 = stack0xffffffffffffffd8 + 1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Base64Encode(char const* bytes_to_encode, unsigned long in_len)
{
    std::string ret;
    int i = 0;
    int j = 0;
    unsigned char char_array_3[3];
    unsigned char char_array_4[4];

    while (in_len--)
    {
        char_array_3[i++] = *(bytes_to_encode++);
        if (i == 3)
        {
            char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
            char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
            char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
            char_array_4[3] = char_array_3[2] & 0x3f;

            for (i = 0; (i < 4); i++)
                ret += base64_chars[char_array_4[i]];
            i = 0;
        }
    }

    if (i)
    {
        for (j = i; j < 3; j++)
            char_array_3[j] = '\0';

        char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
        char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
        char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

        for (j = 0; (j < i + 1); j++)
            ret += base64_chars[char_array_4[j]];

        while ((i++ < 3))
            ret += '=';

    }

    return ret;

}